

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O1

void __thiscall soul::Compiler::addDefaultBuiltInLibrary(Compiler *this)

{
  long in_FS_OFFSET;
  string_view moduleName;
  string_view moduleName_00;
  string_view moduleName_01;
  string_view moduleName_02;
  string_view moduleName_03;
  string_view moduleName_04;
  string_view moduleName_05;
  string_view moduleName_06;
  string_view moduleName_07;
  CompileMessageHandler handler;
  CompileMessageList list;
  CodeLocation local_138;
  CodeLocation local_128;
  CodeLocation local_118;
  CodeLocation local_108;
  CodeLocation local_f8;
  CodeLocation local_e8;
  CodeLocation local_d8;
  CodeLocation local_c8;
  CodeLocation local_b8;
  CodeLocation local_a8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_98._M_unused._M_object = &local_48;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_18 = 0;
  local_80 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_invoke;
  local_98._8_8_ = 0;
  local_88 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_manager;
  local_78 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_98;
  getDefaultLibraryCode();
  compile(this,&local_a8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.sourceCode.object);
  moduleName._M_str = (char *)0x10;
  moduleName._M_len = (size_t)&local_b8;
  getSystemModule(moduleName);
  compile(this,&local_b8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b8.sourceCode.object);
  moduleName_00._M_str = (char *)0x9;
  moduleName_00._M_len = (size_t)&local_c8;
  getSystemModule(moduleName_00);
  compile(this,&local_c8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c8.sourceCode.object);
  moduleName_01._M_str = (char *)0xa;
  moduleName_01._M_len = (size_t)&local_d8;
  getSystemModule(moduleName_01);
  compile(this,&local_d8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d8.sourceCode.object);
  moduleName_02._M_str = (char *)0xe;
  moduleName_02._M_len = (size_t)&local_e8;
  getSystemModule(moduleName_02);
  compile(this,&local_e8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_e8.sourceCode.object);
  moduleName_03._M_str = (char *)0xb;
  moduleName_03._M_len = (size_t)&local_f8;
  getSystemModule(moduleName_03);
  compile(this,&local_f8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_f8.sourceCode.object);
  moduleName_04._M_str = (char *)0x10;
  moduleName_04._M_len = (size_t)&local_108;
  getSystemModule(moduleName_04);
  compile(this,&local_108);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_108.sourceCode.object);
  moduleName_05._M_str = (char *)0xa;
  moduleName_05._M_len = (size_t)&local_118;
  getSystemModule(moduleName_05);
  compile(this,&local_118);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_118.sourceCode.object);
  moduleName_06._M_str = (char *)0xd;
  moduleName_06._M_len = (size_t)&local_128;
  getSystemModule(moduleName_06);
  compile(this,&local_128);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_128.sourceCode.object);
  moduleName_07._M_str = (char *)0xc;
  moduleName_07._M_len = (size_t)&local_138;
  getSystemModule(moduleName_07);
  compile(this,&local_138);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_138.sourceCode.object);
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_98);
  CompileMessageList::~CompileMessageList((CompileMessageList *)&local_48);
  return;
}

Assistant:

void Compiler::addDefaultBuiltInLibrary()
{
    CompileMessageList list;

    try
    {
        soul::CompileMessageHandler handler (list);
        compile (getDefaultLibraryCode());

        // TODO: when we have import & module support, these will no longer be hard-coded here
        compile (getSystemModule ("soul.audio.utils"));
        compile (getSystemModule ("soul.midi"));
        compile (getSystemModule ("soul.notes"));
        compile (getSystemModule ("soul.frequency"));
        compile (getSystemModule ("soul.mixing"));
        compile (getSystemModule ("soul.oscillators"));
        compile (getSystemModule ("soul.noise"));
        compile (getSystemModule ("soul.timeline"));
        compile (getSystemModule ("soul.filters"));
    }
    catch (soul::AbortCompilationException)
    {
        soul::throwInternalCompilerError ("Error in built-in code: " + list.toString());
    }
}